

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedefNameTypeResolver.cpp
# Opt level: O3

Action __thiscall
psy::C::TypedefNameTypeResolver::visitIdentifierDeclarator
          (TypedefNameTypeResolver *this,IdentifierDeclaratorSyntax *node)

{
  SymbolKind SVar1;
  int iVar2;
  Symbol *this_00;
  undefined4 extraout_var;
  Type *pTVar3;
  TypedefNameType *this_01;
  ostream *poVar4;
  Action AVar5;
  
  AVar5 = Skip;
  if (this->inTydefDecltor_ == true) {
    this_00 = &SemanticModel::declarationBy(this->semaModel_,&node->super_DeclaratorSyntax)->
               super_Symbol;
    if (this_00 == (Symbol *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypedefNameTypeResolver.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      iVar2 = 0x40;
    }
    else {
      SVar1 = Symbol::kind(this_00);
      if (SVar1 == TypedefDeclaration) {
        iVar2 = (*this_00->_vptr_Symbol[0x22])(this_00);
        pTVar3 = TypedefDeclarationSymbol::synonymizedType
                           ((TypedefDeclarationSymbol *)CONCAT44(extraout_var,iVar2));
        pTVar3 = resolve(this,pTVar3);
        this_01 = TypedefDeclarationSymbol::introducedSynonymType
                            ((TypedefDeclarationSymbol *)CONCAT44(extraout_var,iVar2));
        TypedefNameType::setResolvedSynonymizedType(this_01,pTVar3);
        return Skip;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypedefNameTypeResolver.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      iVar2 = 0x41;
    }
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    AVar5 = Quit;
  }
  return AVar5;
}

Assistant:

SyntaxVisitor::Action TypedefNameTypeResolver::visitIdentifierDeclarator(
        const IdentifierDeclaratorSyntax* node)
{
    if (!inTydefDecltor_)
        return Action::Skip;

    auto decl = semaModel_->declarationBy(node);
    PSY_ASSERT_2(decl, return Action::Quit);
    PSY_ASSERT_2(decl->kind() == SymbolKind::TypedefDeclaration, return Action::Quit);
    auto tydefDecl = decl->asTypedefDeclaration();
    auto resolvedTy = resolve(tydefDecl->synonymizedType());
    auto tydefNameTy = tydefDecl->introducedSynonymType();
    const_cast<TypedefNameType*>(tydefNameTy)->setResolvedSynonymizedType(resolvedTy);

    return Action::Skip;
}